

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O3

void compute_response_layer_Dyy_top(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  bool *pbVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  float fVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  bool *pbVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  float *pfVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  float *local_180;
  float *local_168;
  int local_158;
  float *local_130;
  ulong local_d8;
  ulong local_a8;
  ulong local_98;
  float *data;
  
  auVar57 = in_ZMM20._0_16_;
  pfVar6 = layer->response;
  iVar1 = layer->filter_size;
  iVar2 = layer->step;
  lVar29 = (long)iVar2;
  iVar3 = iimage->width;
  pbVar7 = layer->laplacian;
  iVar22 = (iVar1 + -1) - (iVar1 + -1 >> 0x1f) >> 1;
  iVar4 = iimage->data_width;
  lVar19 = (long)iVar4;
  iVar11 = iVar1 / 3;
  iVar18 = layer->height;
  uVar12 = iVar1 / 6;
  iVar5 = layer->width;
  fVar60 = 1.0 / (float)(iVar1 * iVar1);
  pfVar8 = iimage->data;
  if (-6 < iVar1) {
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    iVar27 = 0;
    iVar14 = iVar11 + -1 + iVar4 * iVar22;
    iVar15 = iVar11 + -1 + ((iVar11 + -1) - uVar12) * iVar4;
    do {
      if (2 < iVar1) {
        iVar16 = iimage->height;
        iVar35 = iVar27 - iVar11;
        iVar50 = iVar35 + iVar11 * 2;
        iVar17 = iVar35 + 1;
        if (iVar16 < iVar35 + 1) {
          iVar17 = iVar16;
        }
        if (iVar16 <= iVar50) {
          iVar50 = iVar16;
        }
        iVar30 = (iVar17 + -1) * iVar4;
        iVar55 = (iVar50 + -1) * iVar4;
        if (iVar16 < iVar35) {
          iVar35 = iVar16;
        }
        iVar44 = iVar16;
        if (iVar27 < iVar16) {
          iVar44 = iVar27;
        }
        lVar20 = (long)((iVar27 / iVar2) * iVar5);
        iVar23 = (iVar35 + -1) * iVar4;
        iVar36 = (iVar44 + -1) * iVar4;
        iVar31 = iVar27 + 1;
        if (iVar16 < iVar27 + 1) {
          iVar31 = iVar16;
        }
        iVar24 = iVar27 + 1 + iVar11;
        if (iVar24 < iVar16) {
          iVar16 = iVar24;
        }
        iVar37 = (iVar31 + -1) * iVar4;
        iVar24 = (iVar16 + -1) * iVar4;
        lVar26 = 0;
        do {
          fVar61 = 0.0;
          fVar64 = 0.0;
          iVar41 = (int)lVar26;
          iVar52 = iVar41 - iVar22;
          if (iVar3 < iVar41 - iVar22) {
            iVar52 = iVar3;
          }
          iVar34 = (iVar1 - iVar22) + iVar41;
          auVar67 = vfmadd213ss_fma(ZEXT416((uint)pfVar8[iVar15 + iVar41]),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar8[iVar14 + iVar41]));
          if (iVar3 <= iVar34) {
            iVar34 = iVar3;
          }
          if ((0 < iVar17) && (0 < iVar52)) {
            fVar64 = pfVar8[iVar30 + iVar52 + -1];
          }
          if ((0 < iVar17) && (0 < iVar34)) {
            fVar61 = pfVar8[iVar30 + iVar34 + -1];
          }
          fVar63 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar50) && (0 < iVar52)) {
            fVar65 = pfVar8[iVar52 + -1 + iVar55];
          }
          if ((0 < iVar50) && (0 < iVar34)) {
            fVar63 = pfVar8[iVar34 + -1 + iVar55];
          }
          fVar66 = 0.0;
          iVar34 = (iVar11 - uVar12) + iVar41;
          iVar52 = iVar41 - uVar12;
          if (iVar3 < (int)(iVar41 - uVar12)) {
            iVar52 = iVar3;
          }
          if (iVar3 <= iVar34) {
            iVar34 = iVar3;
          }
          if ((0 < iVar17) && (0 < iVar52)) {
            fVar66 = pfVar8[iVar30 + iVar52 + -1];
          }
          fVar68 = 0.0;
          if ((0 < iVar17) && (0 < iVar34)) {
            fVar68 = pfVar8[iVar30 + iVar34 + -1];
          }
          fVar69 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar50) && (0 < iVar52)) {
            fVar70 = pfVar8[iVar52 + -1 + iVar55];
          }
          if ((0 < iVar50) && (0 < iVar34)) {
            fVar69 = pfVar8[iVar34 + -1 + iVar55];
          }
          fVar62 = 0.0;
          iVar52 = iVar41 + 1;
          if (iVar3 < iVar41 + 1) {
            iVar52 = iVar3;
          }
          iVar38 = iVar52 + -1;
          iVar34 = iVar41 + 1 + iVar11;
          if (iVar3 <= iVar34) {
            iVar34 = iVar3;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar61) - fVar65) + fVar63)),
                              ZEXT816(0) << 0x40);
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar66 - fVar68) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar58,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar35) && (0 < iVar52)) {
            fVar64 = pfVar8[iVar23 + iVar38];
          }
          iVar56 = iVar34 + -1;
          if ((0 < iVar35) && (0 < iVar34)) {
            fVar62 = pfVar8[iVar23 + iVar56];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar44) && (0 < iVar52)) {
            fVar61 = pfVar8[iVar36 + iVar38];
          }
          if ((0 < iVar44) && (0 < iVar34)) {
            fVar65 = pfVar8[iVar36 + iVar56];
          }
          fVar63 = 0.0;
          iVar42 = iVar41 - iVar11;
          if (iVar3 < iVar41 - iVar11) {
            iVar42 = iVar3;
          }
          iVar51 = iVar42 + -1;
          iVar28 = iVar3;
          if (iVar41 < iVar3) {
            iVar28 = iVar41;
          }
          if ((0 < iVar31) && (0 < iVar42)) {
            fVar63 = pfVar8[iVar37 + iVar51];
          }
          iVar41 = iVar28 + -1;
          fVar66 = 0.0;
          if ((0 < iVar31) && (0 < iVar28)) {
            fVar66 = pfVar8[iVar37 + iVar41];
          }
          fVar70 = 0.0;
          fVar68 = 0.0;
          if ((0 < iVar16) && (0 < iVar42)) {
            fVar68 = pfVar8[iVar24 + iVar51];
          }
          if ((0 < iVar16) && (0 < iVar28)) {
            fVar70 = pfVar8[iVar24 + iVar41];
          }
          auVar58 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar58);
          if ((0 < iVar35) && (0 < iVar42)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar23 + iVar51]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar58);
          if ((0 < iVar35) && (0 < iVar28)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar23 + iVar41]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar58);
          if ((0 < iVar44) && (0 < iVar42)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar51 + iVar36]);
          }
          if ((0 < iVar44) && (0 < iVar28)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar41 + iVar36]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar58);
          if ((0 < iVar31) && (0 < iVar52)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar37 + iVar38]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar58);
          if ((0 < iVar31) && (0 < iVar34)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar37 + iVar56]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar58);
          if ((0 < iVar16) && (0 < iVar52)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar38 + iVar24]);
          }
          if ((0 < iVar16) && (0 < iVar34)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar56 + iVar24]);
          }
          fVar69 = fVar60 * auVar9._0_4_;
          fVar10 = fVar60 * auVar67._0_4_;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar64 - fVar62) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar70 + ((fVar63 - fVar66) - fVar68))),
                              ZEXT816(0) << 0x40);
          auVar58 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM19._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM18._0_16_);
          auVar59 = vmaxss_avx512f(auVar58,auVar57);
          auVar58 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM24._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM23._0_16_);
          auVar58 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
          fVar64 = fVar60 * (((auVar67._0_4_ + auVar9._0_4_) - auVar59._0_4_) - auVar58._0_4_);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar10));
          pfVar6[lVar20] = auVar67._0_4_;
          pbVar7[lVar20] = 0.0 <= fVar10 + fVar69;
          lVar20 = lVar20 + 1;
          lVar26 = lVar26 + lVar29;
        } while (lVar26 < iVar11);
      }
      iVar14 = iVar14 + iVar2 * iVar4;
      iVar27 = iVar27 + iVar2;
      iVar15 = iVar15 + iVar2 * iVar4;
    } while (iVar27 <= (int)uVar12);
  }
  iVar15 = uVar12 + iVar2;
  uVar13 = iVar15 % iVar2;
  iVar14 = iVar15 - uVar13;
  if (iVar14 <= iVar22) {
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    iVar16 = iVar11 + -1 + ((iVar15 + iVar22) - uVar13) * iVar4;
    iVar35 = iVar2 * iVar4;
    iVar17 = iVar11 + -1 + ((iVar15 + iVar11 + ~uVar13) - uVar12) * iVar4;
    iVar50 = iVar11 + -1 + ((~uVar13 + iVar15) - uVar12) * iVar4;
    iVar27 = iVar14;
    do {
      if (2 < iVar1) {
        iVar30 = iimage->height;
        iVar31 = iVar27 - iVar11;
        iVar23 = (iVar27 / iVar2) * iVar5;
        iVar44 = iVar31 + iVar11 * 2;
        iVar55 = iVar31 + 1;
        if (iVar30 < iVar31 + 1) {
          iVar55 = iVar30;
        }
        if (iVar30 <= iVar44) {
          iVar44 = iVar30;
        }
        iVar24 = (iVar55 + -1) * iVar4;
        iVar36 = (iVar44 + -1) * iVar4;
        if (iVar30 < iVar31) {
          iVar31 = iVar30;
        }
        iVar37 = iVar30;
        if (iVar27 < iVar30) {
          iVar37 = iVar27;
        }
        iVar52 = (iVar31 + -1) * iVar4;
        iVar34 = (iVar37 + -1) * iVar4;
        iVar41 = iVar27 + 1;
        if (iVar30 < iVar27 + 1) {
          iVar41 = iVar30;
        }
        iVar38 = iVar27 + 1 + iVar11;
        if (iVar38 < iVar30) {
          iVar30 = iVar38;
        }
        iVar56 = (iVar41 + -1) * iVar4;
        lVar20 = 0;
        iVar38 = (iVar30 + -1) * iVar4;
        pfVar40 = pfVar6 + iVar23;
        pbVar21 = pbVar7 + iVar23;
        do {
          fVar61 = 0.0;
          fVar64 = 0.0;
          iVar23 = (int)lVar20;
          auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar8[iVar17 + iVar23] - pfVar8[iVar50 + iVar23]
                                                  )),SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)pfVar8[iVar16 + iVar23]));
          iVar42 = iVar23 - iVar22;
          if (iVar3 < iVar23 - iVar22) {
            iVar42 = iVar3;
          }
          iVar28 = (iVar1 - iVar22) + iVar23;
          if (iVar3 <= iVar28) {
            iVar28 = iVar3;
          }
          if ((0 < iVar55) && (0 < iVar42)) {
            fVar64 = pfVar8[iVar24 + iVar42 + -1];
          }
          if ((0 < iVar55) && (0 < iVar28)) {
            fVar61 = pfVar8[iVar24 + iVar28 + -1];
          }
          fVar63 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar44) && (0 < iVar42)) {
            fVar65 = pfVar8[iVar42 + -1 + iVar36];
          }
          if ((0 < iVar44) && (0 < iVar28)) {
            fVar63 = pfVar8[iVar28 + -1 + iVar36];
          }
          fVar66 = 0.0;
          iVar42 = iVar23 - uVar12;
          if (iVar3 < (int)(iVar23 - uVar12)) {
            iVar42 = iVar3;
          }
          iVar28 = (iVar11 - uVar12) + iVar23;
          if (iVar3 <= iVar28) {
            iVar28 = iVar3;
          }
          if ((0 < iVar55) && (0 < iVar42)) {
            fVar66 = pfVar8[iVar24 + iVar42 + -1];
          }
          fVar68 = 0.0;
          if ((0 < iVar55) && (0 < iVar28)) {
            fVar68 = pfVar8[iVar24 + iVar28 + -1];
          }
          fVar69 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar44) && (0 < iVar42)) {
            fVar70 = pfVar8[iVar42 + -1 + iVar36];
          }
          if ((0 < iVar44) && (0 < iVar28)) {
            fVar69 = pfVar8[iVar28 + -1 + iVar36];
          }
          fVar62 = 0.0;
          iVar42 = iVar23 + 1;
          if (iVar3 < iVar23 + 1) {
            iVar42 = iVar3;
          }
          iVar51 = iVar42 + -1;
          iVar28 = iVar23 + 1 + iVar11;
          if (iVar3 <= iVar28) {
            iVar28 = iVar3;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar61) - fVar65) + fVar63)),
                              ZEXT816(0) << 0x40);
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar66 - fVar68) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar58,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar31) && (0 < iVar42)) {
            fVar64 = pfVar8[iVar52 + iVar51];
          }
          iVar46 = iVar28 + -1;
          if ((0 < iVar31) && (0 < iVar28)) {
            fVar62 = pfVar8[iVar52 + iVar46];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar37) && (0 < iVar42)) {
            fVar61 = pfVar8[iVar34 + iVar51];
          }
          if ((0 < iVar37) && (0 < iVar28)) {
            fVar65 = pfVar8[iVar34 + iVar46];
          }
          fVar63 = 0.0;
          iVar32 = iVar23 - iVar11;
          if (iVar3 < iVar23 - iVar11) {
            iVar32 = iVar3;
          }
          iVar33 = iVar3;
          if (iVar23 < iVar3) {
            iVar33 = iVar23;
          }
          iVar23 = iVar32 + -1;
          if ((0 < iVar41) && (0 < iVar32)) {
            fVar63 = pfVar8[iVar56 + iVar23];
          }
          iVar47 = iVar33 + -1;
          fVar66 = 0.0;
          if ((0 < iVar41) && (0 < iVar33)) {
            fVar66 = pfVar8[iVar56 + iVar47];
          }
          fVar70 = 0.0;
          fVar68 = 0.0;
          if ((0 < iVar30) && (0 < iVar32)) {
            fVar68 = pfVar8[iVar38 + iVar23];
          }
          if ((0 < iVar30) && (0 < iVar33)) {
            fVar70 = pfVar8[iVar38 + iVar47];
          }
          auVar58 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar58);
          if ((0 < iVar31) && (0 < iVar32)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar52 + iVar23]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar58);
          if ((0 < iVar31) && (0 < iVar33)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar52 + iVar47]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar58);
          if ((0 < iVar37) && (0 < iVar32)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar23 + iVar34]);
          }
          if ((0 < iVar37) && (0 < iVar33)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar47 + iVar34]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar58);
          if ((0 < iVar41) && (0 < iVar42)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar56 + iVar51]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar58);
          if ((0 < iVar41) && (0 < iVar28)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar56 + iVar46]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar58);
          if ((0 < iVar30) && (0 < iVar42)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar51 + iVar38]);
          }
          if ((0 < iVar30) && (0 < iVar28)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar46 + iVar38]);
          }
          fVar69 = fVar60 * auVar9._0_4_;
          fVar10 = fVar60 * auVar67._0_4_;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar64 - fVar62) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar70 + ((fVar63 - fVar66) - fVar68))),
                              ZEXT816(0) << 0x40);
          auVar58 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM19._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM18._0_16_);
          auVar59 = vmaxss_avx512f(auVar58,auVar57);
          auVar58 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM24._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM23._0_16_);
          auVar58 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
          fVar64 = fVar60 * (((auVar67._0_4_ + auVar9._0_4_) - auVar59._0_4_) - auVar58._0_4_);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar10));
          *pfVar40 = auVar67._0_4_;
          *pbVar21 = 0.0 <= fVar10 + fVar69;
          lVar20 = lVar20 + lVar29;
          pfVar40 = pfVar40 + 1;
          pbVar21 = pbVar21 + 1;
        } while (lVar20 < iVar11);
      }
      iVar16 = iVar16 + iVar35;
      iVar27 = iVar27 + iVar2;
      iVar17 = iVar17 + iVar35;
      iVar50 = iVar50 + iVar35;
    } while (iVar27 <= iVar22);
  }
  iVar27 = iVar11 + -1;
  iVar16 = (iVar27 + iVar2) / iVar2;
  iVar17 = iVar16 * iVar2;
  if (-6 < iVar1) {
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    local_d8 = 0;
    lVar20 = (long)iVar17;
    iVar30 = iVar5 * iVar2 - iVar11;
    iVar50 = ((iVar11 - uVar12) + -1) * iVar4;
    local_168 = pfVar8 + ((lVar19 * iVar22 + lVar20) - (long)iVar11);
    iVar35 = iVar27 + iVar50;
    do {
      if (iVar17 <= iVar30) {
        iVar37 = (int)local_d8;
        iVar23 = iVar37 - iVar11;
        iVar24 = iVar11 + 1 + iVar37;
        iVar55 = iimage->height;
        iVar36 = (int)((long)((ulong)(uint)(iVar37 >> 0x1f) << 0x20 | local_d8 & 0xffffffff) /
                      (long)iVar2) * iVar5 + iVar16;
        iVar31 = iVar11 * 2 + iVar23;
        iVar44 = iVar23 + 1;
        if (iVar55 < iVar23 + 1) {
          iVar44 = iVar55;
        }
        if (iVar55 <= iVar31) {
          iVar31 = iVar55;
        }
        iVar52 = (iVar44 + -1) * iVar4;
        iVar41 = (iVar31 + -1) * iVar4;
        if (iVar55 < iVar23) {
          iVar23 = iVar55;
        }
        iVar34 = iVar55;
        if (iVar37 < iVar55) {
          iVar34 = iVar37;
        }
        iVar56 = (iVar23 + -1) * iVar4;
        iVar42 = (iVar34 + -1) * iVar4;
        iVar38 = iVar37 + 1;
        if (iVar55 < iVar37 + 1) {
          iVar38 = iVar55;
        }
        if (iVar24 < iVar55) {
          iVar55 = iVar24;
        }
        lVar26 = 0;
        iVar24 = (iVar38 + -1) * iVar4;
        iVar37 = (iVar55 + -1) * iVar4;
        pfVar40 = pfVar6 + iVar36;
        pbVar21 = pbVar7 + iVar36;
        iVar36 = iVar17;
        do {
          iVar28 = iVar36 - iVar22;
          if (iVar3 < iVar36 - iVar22) {
            iVar28 = iVar3;
          }
          iVar51 = (iVar1 - iVar22) + iVar36;
          if (iVar3 <= iVar51) {
            iVar51 = iVar3;
          }
          fVar61 = 0.0;
          auVar67 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[iVar35 + iVar36] -
                                                  pfVar8[(lVar20 + iVar50 + lVar26) - (long)iVar11])
                                           ),ZEXT416((uint)(pfVar8[(local_d8 + (long)iVar22) *
                                                                   lVar19 + (long)(iVar27 + iVar36)]
                                                           - local_168[lVar26])),
                                    SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar44) && (fVar64 = 0.0, 0 < iVar28)) {
            fVar64 = pfVar8[iVar52 + iVar28 + -1];
          }
          if ((0 < iVar44) && (0 < iVar51)) {
            fVar61 = pfVar8[iVar52 + iVar51 + -1];
          }
          fVar63 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar31) && (0 < iVar28)) {
            fVar65 = pfVar8[iVar28 + -1 + iVar41];
          }
          if ((0 < iVar31) && (0 < iVar51)) {
            fVar63 = pfVar8[iVar51 + -1 + iVar41];
          }
          fVar66 = 0.0;
          iVar51 = (iVar11 - uVar12) + iVar36;
          iVar28 = iVar36 - uVar12;
          if (iVar3 < (int)(iVar36 - uVar12)) {
            iVar28 = iVar3;
          }
          if (iVar3 <= iVar51) {
            iVar51 = iVar3;
          }
          if ((0 < iVar44) && (0 < iVar28)) {
            fVar66 = pfVar8[iVar52 + iVar28 + -1];
          }
          fVar68 = 0.0;
          if ((0 < iVar44) && (0 < iVar51)) {
            fVar68 = pfVar8[iVar52 + iVar51 + -1];
          }
          fVar69 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar31) && (0 < iVar28)) {
            fVar70 = pfVar8[iVar28 + -1 + iVar41];
          }
          if ((0 < iVar31) && (0 < iVar51)) {
            fVar69 = pfVar8[iVar51 + -1 + iVar41];
          }
          fVar62 = 0.0;
          iVar28 = iVar36 + 1;
          if (iVar3 < iVar36 + 1) {
            iVar28 = iVar3;
          }
          iVar46 = iVar28 + -1;
          iVar51 = iVar36 + 1 + iVar11;
          if (iVar3 <= iVar51) {
            iVar51 = iVar3;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar61) - fVar65) + fVar63)),
                              ZEXT816(0) << 0x40);
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar66 - fVar68) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar58,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar23) && (0 < iVar28)) {
            fVar64 = pfVar8[iVar56 + iVar46];
          }
          iVar32 = iVar51 + -1;
          if ((0 < iVar23) && (0 < iVar51)) {
            fVar62 = pfVar8[iVar56 + iVar32];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar34) && (0 < iVar28)) {
            fVar61 = pfVar8[iVar42 + iVar46];
          }
          if ((0 < iVar34) && (0 < iVar51)) {
            fVar65 = pfVar8[iVar42 + iVar32];
          }
          fVar63 = 0.0;
          iVar33 = iVar36 - iVar11;
          if (iVar3 < iVar36 - iVar11) {
            iVar33 = iVar3;
          }
          iVar47 = iVar3;
          if (iVar36 < iVar3) {
            iVar47 = iVar36;
          }
          iVar53 = iVar33 + -1;
          if ((0 < iVar38) && (0 < iVar33)) {
            fVar63 = pfVar8[iVar24 + iVar53];
          }
          iVar43 = iVar47 + -1;
          fVar66 = 0.0;
          if ((0 < iVar38) && (0 < iVar47)) {
            fVar66 = pfVar8[iVar24 + iVar43];
          }
          fVar70 = 0.0;
          fVar68 = 0.0;
          if ((0 < iVar55) && (0 < iVar33)) {
            fVar68 = pfVar8[iVar37 + iVar53];
          }
          if ((0 < iVar55) && (0 < iVar47)) {
            fVar70 = pfVar8[iVar37 + iVar43];
          }
          auVar58 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar58);
          if ((0 < iVar23) && (0 < iVar33)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar56 + iVar53]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar58);
          if ((0 < iVar23) && (0 < iVar47)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar56 + iVar43]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar58);
          if ((0 < iVar34) && (0 < iVar33)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar53 + iVar42]);
          }
          if ((0 < iVar34) && (0 < iVar47)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar43 + iVar42]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar58);
          if ((0 < iVar38) && (0 < iVar28)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar24 + iVar46]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar58);
          if ((0 < iVar38) && (0 < iVar51)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar24 + iVar32]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar58);
          if ((0 < iVar55) && (0 < iVar28)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar46 + iVar37]);
          }
          if ((0 < iVar55) && (0 < iVar51)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar32 + iVar37]);
          }
          fVar69 = fVar60 * auVar9._0_4_;
          fVar10 = fVar60 * auVar67._0_4_;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar64 - fVar62) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar70 + ((fVar63 - fVar66) - fVar68))),
                              ZEXT816(0) << 0x40);
          auVar58 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM19._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM18._0_16_);
          auVar59 = vmaxss_avx512f(auVar58,auVar57);
          auVar58 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM24._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM23._0_16_);
          auVar58 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
          fVar64 = fVar60 * (((auVar67._0_4_ + auVar9._0_4_) - auVar59._0_4_) - auVar58._0_4_);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar10));
          *pfVar40 = auVar67._0_4_;
          *pbVar21 = 0.0 <= fVar10 + fVar69;
          lVar26 = lVar26 + lVar29;
          pfVar40 = pfVar40 + 1;
          pbVar21 = pbVar21 + 1;
          iVar36 = iVar36 + iVar2;
        } while (lVar20 + lVar26 <= (long)iVar30);
      }
      iVar50 = iVar50 + iVar2 * iVar4;
      local_d8 = local_d8 + lVar29;
      local_168 = local_168 + lVar29 * lVar19;
      iVar35 = iVar35 + iVar2 * iVar4;
    } while ((long)local_d8 <= (long)(int)uVar12);
  }
  iVar50 = iVar5 * iVar2;
  if (iVar14 <= iVar22) {
    lVar26 = (long)iVar17;
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    lVar49 = (long)iVar22;
    lVar20 = (long)iVar11;
    local_130 = pfVar8 + ((((iVar15 + lVar49) - (long)(int)uVar13) * lVar19 + lVar26) - lVar20);
    local_a8 = (ulong)iVar14;
    iVar35 = ((iVar15 + iVar11 + ~uVar13) - uVar12) * iVar4;
    iVar55 = iVar2 * iVar4;
    iVar44 = ((~uVar13 + iVar15) - uVar12) * iVar4;
    iVar15 = iVar27 + iVar35;
    iVar30 = iVar27 + iVar44;
    do {
      if (iVar17 <= iVar50 - iVar11) {
        iVar41 = (int)local_a8;
        iVar31 = iimage->height;
        iVar24 = iVar41 - iVar11;
        iVar36 = iVar11 * 2 + iVar24;
        iVar37 = (int)((long)((ulong)(uint)(iVar41 >> 0x1f) << 0x20 | local_a8 & 0xffffffff) /
                      (long)iVar2) * iVar5 + iVar16;
        iVar23 = iVar24 + 1;
        if (iVar31 < iVar24 + 1) {
          iVar23 = iVar31;
        }
        if (iVar31 <= iVar36) {
          iVar36 = iVar31;
        }
        iVar34 = (iVar23 + -1) * iVar4;
        iVar52 = (iVar36 + -1) * iVar4;
        if (iVar31 < iVar24) {
          iVar24 = iVar31;
        }
        iVar38 = iVar31;
        if (iVar41 < iVar31) {
          iVar38 = iVar41;
        }
        iVar42 = (iVar24 + -1) * iVar4;
        iVar51 = (iVar38 + -1) * iVar4;
        iVar28 = iVar11 + 1 + iVar41;
        iVar56 = iVar41 + 1;
        if (iVar31 < iVar41 + 1) {
          iVar56 = iVar31;
        }
        if (iVar28 < iVar31) {
          iVar31 = iVar28;
        }
        lVar45 = 0;
        iVar41 = (iVar56 + -1) * iVar4;
        iVar28 = (iVar31 + -1) * iVar4;
        pfVar40 = pfVar6 + iVar37;
        pbVar21 = pbVar7 + iVar37;
        iVar37 = iVar17;
        do {
          iVar46 = iVar37 - iVar22;
          if (iVar3 < iVar37 - iVar22) {
            iVar46 = iVar3;
          }
          iVar32 = (iVar1 - iVar22) + iVar37;
          if (iVar3 <= iVar32) {
            iVar32 = iVar3;
          }
          fVar61 = 0.0;
          auVar67 = vfmadd132ss_fma(ZEXT416((uint)((pfVar8[(lVar26 + iVar44 + lVar45) - lVar20] -
                                                   pfVar8[(lVar26 + iVar35 + lVar45) - lVar20]) +
                                                  (pfVar8[iVar15 + iVar37] - pfVar8[iVar30 + iVar37]
                                                  ))),
                                    ZEXT416((uint)(pfVar8[(lVar49 + local_a8) * lVar19 +
                                                          (long)(iVar27 + iVar37)] -
                                                  local_130[lVar45])),SUB6416(ZEXT464(0xc0400000),0)
                                   );
          fVar64 = 0.0;
          if ((0 < iVar23) && (fVar64 = 0.0, 0 < iVar46)) {
            fVar64 = pfVar8[iVar34 + iVar46 + -1];
          }
          if ((0 < iVar23) && (0 < iVar32)) {
            fVar61 = pfVar8[iVar34 + iVar32 + -1];
          }
          fVar63 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar36) && (0 < iVar46)) {
            fVar65 = pfVar8[iVar46 + -1 + iVar52];
          }
          if ((0 < iVar36) && (0 < iVar32)) {
            fVar63 = pfVar8[iVar32 + -1 + iVar52];
          }
          fVar66 = 0.0;
          iVar46 = iVar37 - uVar12;
          if (iVar3 < (int)(iVar37 - uVar12)) {
            iVar46 = iVar3;
          }
          iVar32 = (iVar11 - uVar12) + iVar37;
          if (iVar3 <= iVar32) {
            iVar32 = iVar3;
          }
          if ((0 < iVar23) && (0 < iVar46)) {
            fVar66 = pfVar8[iVar34 + iVar46 + -1];
          }
          fVar68 = 0.0;
          if ((0 < iVar23) && (0 < iVar32)) {
            fVar68 = pfVar8[iVar34 + iVar32 + -1];
          }
          fVar69 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar36) && (0 < iVar46)) {
            fVar70 = pfVar8[iVar46 + -1 + iVar52];
          }
          if ((0 < iVar36) && (0 < iVar32)) {
            fVar69 = pfVar8[iVar32 + -1 + iVar52];
          }
          fVar62 = 0.0;
          iVar46 = iVar37 + 1;
          if (iVar3 < iVar37 + 1) {
            iVar46 = iVar3;
          }
          iVar33 = iVar46 + -1;
          iVar32 = iVar37 + 1 + iVar11;
          if (iVar3 <= iVar32) {
            iVar32 = iVar3;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar61) - fVar65) + fVar63)),
                              ZEXT816(0) << 0x40);
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar66 - fVar68) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar58,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar24) && (0 < iVar46)) {
            fVar64 = pfVar8[iVar42 + iVar33];
          }
          iVar47 = iVar32 + -1;
          if ((0 < iVar24) && (0 < iVar32)) {
            fVar62 = pfVar8[iVar42 + iVar47];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar38) && (0 < iVar46)) {
            fVar61 = pfVar8[iVar51 + iVar33];
          }
          if ((0 < iVar38) && (0 < iVar32)) {
            fVar65 = pfVar8[iVar51 + iVar47];
          }
          fVar63 = 0.0;
          iVar53 = iVar37 - iVar11;
          if (iVar3 < iVar37 - iVar11) {
            iVar53 = iVar3;
          }
          iVar43 = iVar3;
          if (iVar37 < iVar3) {
            iVar43 = iVar37;
          }
          iVar54 = iVar53 + -1;
          if ((0 < iVar56) && (0 < iVar53)) {
            fVar63 = pfVar8[iVar41 + iVar54];
          }
          iVar39 = iVar43 + -1;
          fVar66 = 0.0;
          if ((0 < iVar56) && (0 < iVar43)) {
            fVar66 = pfVar8[iVar41 + iVar39];
          }
          fVar70 = 0.0;
          fVar68 = 0.0;
          if ((0 < iVar31) && (0 < iVar53)) {
            fVar68 = pfVar8[iVar28 + iVar54];
          }
          if ((0 < iVar31) && (0 < iVar43)) {
            fVar70 = pfVar8[iVar28 + iVar39];
          }
          auVar58 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar58);
          if ((0 < iVar24) && (0 < iVar53)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar42 + iVar54]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar58);
          if ((0 < iVar24) && (0 < iVar43)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar42 + iVar39]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar58);
          if ((0 < iVar38) && (0 < iVar53)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar54 + iVar51]);
          }
          if ((0 < iVar38) && (0 < iVar43)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar39 + iVar51]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar58);
          if ((0 < iVar56) && (0 < iVar46)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar41 + iVar33]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar58);
          if ((0 < iVar56) && (0 < iVar32)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar41 + iVar47]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar58);
          if ((0 < iVar31) && (0 < iVar46)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar33 + iVar28]);
          }
          if ((0 < iVar31) && (0 < iVar32)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar47 + iVar28]);
          }
          fVar69 = fVar60 * auVar9._0_4_;
          fVar10 = fVar60 * auVar67._0_4_;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar64 - fVar62) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar70 + ((fVar63 - fVar66) - fVar68))),
                              ZEXT816(0) << 0x40);
          auVar58 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM19._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM18._0_16_);
          auVar59 = vmaxss_avx512f(auVar58,auVar57);
          auVar58 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM24._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM23._0_16_);
          auVar58 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
          fVar64 = fVar60 * (((auVar67._0_4_ + auVar9._0_4_) - auVar59._0_4_) - auVar58._0_4_);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar10));
          *pfVar40 = auVar67._0_4_;
          *pbVar21 = 0.0 <= fVar10 + fVar69;
          lVar45 = lVar45 + lVar29;
          pfVar40 = pfVar40 + 1;
          pbVar21 = pbVar21 + 1;
          iVar37 = iVar37 + iVar2;
        } while (lVar26 + lVar45 <= (long)(iVar50 - iVar11));
      }
      iVar35 = iVar35 + iVar55;
      local_a8 = local_a8 + lVar29;
      iVar44 = iVar44 + iVar55;
      local_130 = local_130 + lVar29 * lVar19;
      iVar15 = iVar15 + iVar55;
      iVar30 = iVar30 + iVar55;
    } while ((long)local_a8 <= lVar49);
  }
  iVar15 = ((iVar2 - iVar11) + iVar50) / iVar2;
  iVar27 = iVar15 * iVar2;
  if (-6 < iVar1) {
    lVar20 = (long)iVar27;
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    local_98 = 0;
    local_180 = pfVar8 + ((lVar19 * iVar22 + lVar20) - (long)iVar11);
    local_158 = ((iVar11 - uVar12) + -1) * iVar4;
    do {
      if (iVar27 < iVar50) {
        iVar31 = (int)local_98;
        iVar30 = iVar31 - iVar11;
        iVar44 = iVar11 + 1 + iVar31;
        iVar55 = (int)((long)((ulong)(uint)(iVar31 >> 0x1f) << 0x20 | local_98 & 0xffffffff) /
                      (long)iVar2) * iVar5 + iVar15;
        iVar16 = iimage->height;
        iVar35 = iVar11 * 2 + iVar30;
        iVar17 = iVar30 + 1;
        if (iVar16 < iVar30 + 1) {
          iVar17 = iVar16;
        }
        if (iVar16 <= iVar35) {
          iVar35 = iVar16;
        }
        iVar23 = (iVar17 + -1) * iVar4;
        iVar36 = (iVar35 + -1) * iVar4;
        if (iVar16 < iVar30) {
          iVar30 = iVar16;
        }
        iVar24 = iVar16;
        if (iVar31 < iVar16) {
          iVar24 = iVar31;
        }
        iVar41 = (iVar30 + -1) * iVar4;
        iVar52 = (iVar24 + -1) * iVar4;
        iVar37 = iVar31 + 1;
        if (iVar16 < iVar31 + 1) {
          iVar37 = iVar16;
        }
        if (iVar44 < iVar16) {
          iVar16 = iVar44;
        }
        iVar44 = (iVar37 + -1) * iVar4;
        lVar26 = 0;
        iVar34 = (iVar16 + -1) * iVar4;
        pfVar40 = pfVar6 + iVar55;
        pbVar21 = pbVar7 + iVar55;
        iVar55 = iVar27;
        do {
          fVar64 = 0.0;
          iVar56 = (iVar1 - iVar22) + iVar55;
          iVar38 = iVar55 - iVar22;
          if (iVar3 < iVar55 - iVar22) {
            iVar38 = iVar3;
          }
          if (iVar3 <= iVar56) {
            iVar56 = iVar3;
          }
          auVar67 = vfmadd132ss_fma(ZEXT416((uint)(pfVar8[(long)(int)((~uVar12 + iVar11 + iVar31) *
                                                                      iVar4 + iVar3) + -1] -
                                                  pfVar8[(lVar20 + local_158 + lVar26) -
                                                         (long)iVar11])),
                                    ZEXT416((uint)(pfVar8[(long)iVar3 +
                                                          ((long)iVar22 + local_98) * lVar19 + -1] -
                                                  local_180[lVar26])),SUB6416(ZEXT464(0xc0400000),0)
                                   );
          fVar61 = 0.0;
          if ((0 < iVar17) && (0 < iVar38)) {
            fVar64 = pfVar8[iVar23 + iVar38 + -1];
          }
          if ((0 < iVar17) && (0 < iVar56)) {
            fVar61 = pfVar8[iVar23 + iVar56 + -1];
          }
          fVar63 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar35) && (0 < iVar38)) {
            fVar65 = pfVar8[iVar38 + -1 + iVar36];
          }
          if ((0 < iVar35) && (0 < iVar56)) {
            fVar63 = pfVar8[iVar56 + -1 + iVar36];
          }
          fVar66 = 0.0;
          iVar56 = (iVar11 - uVar12) + iVar55;
          iVar38 = iVar55 - uVar12;
          if (iVar3 < (int)(iVar55 - uVar12)) {
            iVar38 = iVar3;
          }
          if (iVar3 <= iVar56) {
            iVar56 = iVar3;
          }
          if ((0 < iVar17) && (0 < iVar38)) {
            fVar66 = pfVar8[iVar23 + iVar38 + -1];
          }
          fVar68 = 0.0;
          if ((0 < iVar17) && (0 < iVar56)) {
            fVar68 = pfVar8[iVar23 + iVar56 + -1];
          }
          fVar69 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar35) && (0 < iVar38)) {
            fVar70 = pfVar8[iVar38 + -1 + iVar36];
          }
          if ((0 < iVar35) && (0 < iVar56)) {
            fVar69 = pfVar8[iVar56 + -1 + iVar36];
          }
          fVar62 = 0.0;
          iVar38 = iVar55 + 1;
          if (iVar3 < iVar55 + 1) {
            iVar38 = iVar3;
          }
          iVar42 = iVar38 + -1;
          iVar56 = iVar55 + 1 + iVar11;
          if (iVar3 <= iVar56) {
            iVar56 = iVar3;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar61) - fVar65) + fVar63)),
                              ZEXT816(0) << 0x40);
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar66 - fVar68) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar58,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar30) && (0 < iVar38)) {
            fVar64 = pfVar8[iVar41 + iVar42];
          }
          iVar28 = iVar56 + -1;
          if ((0 < iVar30) && (0 < iVar56)) {
            fVar62 = pfVar8[iVar41 + iVar28];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar24) && (0 < iVar38)) {
            fVar61 = pfVar8[iVar52 + iVar42];
          }
          if ((0 < iVar24) && (0 < iVar56)) {
            fVar65 = pfVar8[iVar52 + iVar28];
          }
          fVar63 = 0.0;
          iVar51 = iVar55 - iVar11;
          if (iVar3 < iVar55 - iVar11) {
            iVar51 = iVar3;
          }
          iVar46 = iVar3;
          if (iVar55 < iVar3) {
            iVar46 = iVar55;
          }
          iVar32 = iVar51 + -1;
          if ((0 < iVar37) && (0 < iVar51)) {
            fVar63 = pfVar8[iVar44 + iVar32];
          }
          iVar33 = iVar46 + -1;
          fVar66 = 0.0;
          if ((0 < iVar37) && (0 < iVar46)) {
            fVar66 = pfVar8[iVar44 + iVar33];
          }
          fVar70 = 0.0;
          fVar68 = 0.0;
          if ((0 < iVar16) && (0 < iVar51)) {
            fVar68 = pfVar8[iVar34 + iVar32];
          }
          if ((0 < iVar16) && (0 < iVar46)) {
            fVar70 = pfVar8[iVar34 + iVar33];
          }
          auVar58 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar58);
          if ((0 < iVar30) && (0 < iVar51)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar41 + iVar32]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar58);
          if ((0 < iVar30) && (0 < iVar46)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar41 + iVar33]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar58);
          if ((0 < iVar24) && (0 < iVar51)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar32 + iVar52]);
          }
          if ((0 < iVar24) && (0 < iVar46)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar33 + iVar52]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar58);
          if ((0 < iVar37) && (0 < iVar38)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar44 + iVar42]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar58);
          if ((0 < iVar37) && (0 < iVar56)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar44 + iVar28]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar58);
          if ((0 < iVar16) && (0 < iVar38)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar42 + iVar34]);
          }
          if ((0 < iVar16) && (0 < iVar56)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar28 + iVar34]);
          }
          fVar69 = fVar60 * auVar9._0_4_;
          fVar10 = fVar60 * auVar67._0_4_;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar64 - fVar62) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar70 + ((fVar63 - fVar66) - fVar68))),
                              ZEXT816(0) << 0x40);
          auVar58 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM19._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM18._0_16_);
          auVar59 = vmaxss_avx512f(auVar58,auVar57);
          auVar58 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM24._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM23._0_16_);
          auVar58 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
          fVar64 = fVar60 * (((auVar67._0_4_ + auVar9._0_4_) - auVar59._0_4_) - auVar58._0_4_);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64 * -0.81)),ZEXT416((uint)fVar69),
                                    ZEXT416((uint)fVar10));
          *pfVar40 = auVar67._0_4_;
          *pbVar21 = 0.0 <= fVar10 + fVar69;
          lVar26 = lVar26 + lVar29;
          pfVar40 = pfVar40 + 1;
          pbVar21 = pbVar21 + 1;
          iVar55 = iVar55 + iVar2;
        } while (lVar20 + lVar26 < (long)iVar50);
      }
      local_158 = local_158 + iVar2 * iVar4;
      local_180 = local_180 + lVar29 * lVar19;
      local_98 = local_98 + lVar29;
    } while ((long)local_98 <= (long)(int)uVar12);
  }
  if (iVar14 <= iVar22) {
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    do {
      if (iVar27 < iVar50) {
        iVar30 = iVar14 - uVar12;
        iVar16 = iimage->height;
        iVar35 = iVar14 - iVar11;
        iVar17 = iVar35 + 1;
        if (iVar16 < iVar35 + 1) {
          iVar17 = iVar16;
        }
        iVar55 = iVar35 + iVar11 * 2;
        if (iVar16 <= iVar55) {
          iVar55 = iVar16;
        }
        iVar23 = (iVar17 + -1) * iVar4;
        iVar31 = (iVar55 + -1) * iVar4;
        iVar36 = iVar14 - iVar22;
        iVar44 = iVar36;
        if (iVar16 < iVar36) {
          iVar44 = iVar16;
        }
        iVar24 = iVar36 + iVar1;
        if (iVar16 <= iVar36 + iVar1) {
          iVar24 = iVar16;
        }
        iVar41 = (iVar44 + -1) * iVar4;
        iVar37 = (iVar24 + -1) * iVar4;
        iVar36 = iVar30;
        if (iVar16 < iVar30) {
          iVar36 = iVar16;
        }
        iVar34 = iVar14 + 1 + iVar11;
        iVar52 = iVar30 + iVar11;
        if (iVar16 <= iVar30 + iVar11) {
          iVar52 = iVar16;
        }
        iVar38 = (iVar36 + -1) * iVar4;
        iVar30 = (iVar52 + -1) * iVar4;
        if (iVar16 < iVar35) {
          iVar35 = iVar16;
        }
        iVar56 = iVar16;
        if (iVar14 < iVar16) {
          iVar56 = iVar14;
        }
        iVar28 = (iVar35 + -1) * iVar4;
        lVar19 = (long)((iVar14 / iVar2) * iVar5 + iVar15);
        iVar51 = (iVar56 + -1) * iVar4;
        iVar42 = iVar14 + 1;
        if (iVar16 < iVar14 + 1) {
          iVar42 = iVar16;
        }
        if (iVar34 < iVar16) {
          iVar16 = iVar34;
        }
        iVar46 = (iVar42 + -1) * iVar4;
        iVar32 = (iVar16 + -1) * iVar4;
        iVar34 = iVar27;
        do {
          fVar61 = 0.0;
          fVar64 = 0.0;
          iVar33 = iVar34 - iVar22;
          if (iVar3 < iVar34 - iVar22) {
            iVar33 = iVar3;
          }
          iVar47 = (iVar1 - iVar22) + iVar34;
          if (iVar3 <= iVar47) {
            iVar47 = iVar3;
          }
          if ((0 < iVar17) && (0 < iVar33)) {
            fVar64 = pfVar8[iVar23 + iVar33 + -1];
          }
          if ((0 < iVar17) && (0 < iVar47)) {
            fVar61 = pfVar8[iVar23 + iVar47 + -1];
          }
          fVar63 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar55) && (0 < iVar33)) {
            fVar65 = pfVar8[iVar33 + -1 + iVar31];
          }
          if ((0 < iVar55) && (0 < iVar47)) {
            fVar63 = pfVar8[iVar47 + -1 + iVar31];
          }
          auVar67 = ZEXT816(0) << 0x40;
          fVar66 = 0.0;
          iVar33 = iVar34 - uVar12;
          if (iVar3 < (int)(iVar34 - uVar12)) {
            iVar33 = iVar3;
          }
          iVar47 = (iVar11 - uVar12) + iVar34;
          if (iVar3 <= iVar47) {
            iVar47 = iVar3;
          }
          if ((0 < iVar17) && (0 < iVar33)) {
            fVar66 = pfVar8[iVar23 + iVar33 + -1];
          }
          fVar68 = 0.0;
          if ((0 < iVar17) && (0 < iVar47)) {
            fVar68 = pfVar8[iVar23 + iVar47 + -1];
          }
          fVar69 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar55) && (0 < iVar33)) {
            fVar70 = pfVar8[iVar33 + -1 + iVar31];
          }
          if ((0 < iVar55) && (0 < iVar47)) {
            fVar69 = pfVar8[iVar47 + -1 + iVar31];
          }
          iVar33 = -iVar11 + 1 + iVar34;
          fVar62 = 0.0;
          if (iVar3 < iVar33) {
            iVar33 = iVar3;
          }
          iVar53 = iVar33 + -1;
          iVar47 = iVar11 + iVar34;
          if (iVar3 <= iVar11 + iVar34) {
            iVar47 = iVar3;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar61) - fVar65) + fVar63)),auVar67);
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar66 - fVar68) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar58,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar44) && (0 < iVar33)) {
            fVar64 = pfVar8[iVar41 + iVar53];
          }
          iVar43 = iVar47 + -1;
          if ((0 < iVar44) && (0 < iVar47)) {
            fVar62 = pfVar8[iVar41 + iVar43];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar24) && (0 < iVar33)) {
            fVar61 = pfVar8[iVar37 + iVar53];
          }
          if ((0 < iVar24) && (0 < iVar47)) {
            fVar65 = pfVar8[iVar37 + iVar43];
          }
          if ((0 < iVar36) && (0 < iVar33)) {
            auVar67 = ZEXT416((uint)pfVar8[iVar38 + iVar53]);
          }
          fVar63 = 0.0;
          if ((0 < iVar36) && (0 < iVar47)) {
            fVar63 = pfVar8[iVar38 + iVar43];
          }
          fVar68 = 0.0;
          fVar66 = 0.0;
          if ((0 < iVar52) && (0 < iVar33)) {
            fVar66 = pfVar8[iVar53 + iVar30];
          }
          if ((0 < iVar52) && (0 < iVar47)) {
            fVar68 = pfVar8[iVar43 + iVar30];
          }
          fVar70 = 0.0;
          iVar33 = iVar34 + 1;
          if (iVar3 < iVar34 + 1) {
            iVar33 = iVar3;
          }
          iVar53 = iVar33 + -1;
          iVar47 = iVar34 + 1 + iVar11;
          if (iVar3 <= iVar47) {
            iVar47 = iVar3;
          }
          auVar58 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar62) - fVar61) + fVar65)),
                               ZEXT816(0) << 0x40);
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((auVar67._0_4_ - fVar63) - fVar66))),
                               ZEXT816(0) << 0x40);
          auVar67 = vfmadd132ss_fma(auVar67,auVar58,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar35) && (0 < iVar33)) {
            fVar64 = pfVar8[iVar28 + iVar53];
          }
          iVar43 = iVar47 + -1;
          if ((0 < iVar35) && (0 < iVar47)) {
            fVar70 = pfVar8[iVar28 + iVar43];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar56) && (0 < iVar33)) {
            fVar61 = pfVar8[iVar51 + iVar53];
          }
          if ((0 < iVar56) && (0 < iVar47)) {
            fVar65 = pfVar8[iVar51 + iVar43];
          }
          iVar54 = -iVar11 + iVar34;
          fVar63 = 0.0;
          if (iVar3 < iVar54) {
            iVar54 = iVar3;
          }
          iVar48 = iVar54 + -1;
          iVar39 = iVar3;
          if (iVar34 < iVar3) {
            iVar39 = iVar34;
          }
          if ((0 < iVar42) && (0 < iVar54)) {
            fVar63 = pfVar8[iVar46 + iVar48];
          }
          iVar25 = iVar39 + -1;
          fVar66 = 0.0;
          if ((0 < iVar42) && (0 < iVar39)) {
            fVar66 = pfVar8[iVar46 + iVar25];
          }
          fVar69 = 0.0;
          fVar68 = 0.0;
          if ((0 < iVar16) && (0 < iVar54)) {
            fVar68 = pfVar8[iVar32 + iVar48];
          }
          if ((0 < iVar16) && (0 < iVar39)) {
            fVar69 = pfVar8[iVar32 + iVar25];
          }
          auVar58 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar58);
          if ((0 < iVar35) && (0 < iVar54)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar28 + iVar48]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar58);
          if ((0 < iVar35) && (0 < iVar39)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar28 + iVar25]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar58);
          if ((0 < iVar56) && (0 < iVar54)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar48 + iVar51]);
          }
          if ((0 < iVar56) && (0 < iVar39)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar25 + iVar51]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar58);
          if ((0 < iVar42) && (0 < iVar33)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar46 + iVar53]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar58);
          if ((0 < iVar42) && (0 < iVar47)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar46 + iVar43]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar58);
          if ((0 < iVar16) && (0 < iVar33)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar53 + iVar32]);
          }
          if ((0 < iVar16) && (0 < iVar47)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar43 + iVar32]);
          }
          fVar62 = fVar60 * auVar9._0_4_;
          fVar10 = fVar60 * auVar67._0_4_;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar64 - fVar70) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar63 - fVar66) - fVar68))),
                              ZEXT816(0) << 0x40);
          auVar58 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM19._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM18._0_16_);
          auVar59 = vmaxss_avx512f(auVar58,auVar57);
          auVar58 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM24._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM23._0_16_);
          auVar58 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
          fVar64 = fVar60 * (((auVar67._0_4_ + auVar9._0_4_) - auVar59._0_4_) - auVar58._0_4_);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64 * -0.81)),ZEXT416((uint)fVar62),
                                    ZEXT416((uint)fVar10));
          pfVar6[lVar19] = auVar67._0_4_;
          pbVar7[lVar19] = 0.0 <= fVar62 + fVar10;
          lVar19 = lVar19 + 1;
          iVar34 = iVar34 + iVar2;
        } while (iVar34 < iVar50);
      }
      iVar14 = iVar14 + iVar2;
    } while (iVar14 <= iVar22);
  }
  iVar14 = (iVar22 + iVar2) - (iVar22 + iVar2) % iVar2;
  iVar18 = iVar18 * iVar2;
  if (iVar14 < iVar18) {
    auVar57 = vxorps_avx512vl(auVar57,auVar57);
    do {
      if (0 < iVar50) {
        iVar17 = iVar14 - iVar11;
        iVar15 = iimage->height;
        lVar19 = (long)((iVar14 / iVar2) * iVar5);
        iVar16 = iVar17 + iVar11 * 2;
        iVar27 = iVar17 + 1;
        if (iVar15 < iVar17 + 1) {
          iVar27 = iVar15;
        }
        if (iVar15 <= iVar16) {
          iVar16 = iVar15;
        }
        iVar44 = (iVar27 + -1) * iVar4;
        iVar30 = (iVar16 + -1) * iVar4;
        iVar55 = iVar14 - iVar22;
        iVar35 = iVar55;
        if (iVar15 < iVar55) {
          iVar35 = iVar15;
        }
        iVar31 = iVar55 + iVar1;
        if (iVar15 <= iVar55 + iVar1) {
          iVar31 = iVar15;
        }
        iVar24 = (iVar35 + -1) * iVar4;
        iVar23 = (iVar31 + -1) * iVar4;
        iVar36 = iVar14 - uVar12;
        iVar55 = iVar36;
        if (iVar15 < iVar36) {
          iVar55 = iVar15;
        }
        iVar37 = iVar36 + iVar11;
        if (iVar15 <= iVar36 + iVar11) {
          iVar37 = iVar15;
        }
        iVar41 = (iVar55 + -1) * iVar4;
        iVar36 = (iVar37 + -1) * iVar4;
        if (iVar15 < iVar17) {
          iVar17 = iVar15;
        }
        iVar52 = iVar15;
        if (iVar14 < iVar15) {
          iVar52 = iVar14;
        }
        iVar38 = (iVar17 + -1) * iVar4;
        iVar56 = (iVar52 + -1) * iVar4;
        iVar34 = iVar14 + 1;
        if (iVar15 < iVar14 + 1) {
          iVar34 = iVar15;
        }
        iVar42 = iVar14 + 1 + iVar11;
        if (iVar42 < iVar15) {
          iVar15 = iVar42;
        }
        iVar51 = 0;
        iVar42 = (iVar34 + -1) * iVar4;
        iVar28 = (iVar15 + -1) * iVar4;
        do {
          fVar61 = 0.0;
          fVar64 = 0.0;
          iVar46 = iVar51 - iVar22;
          if (iVar3 < iVar51 - iVar22) {
            iVar46 = iVar3;
          }
          iVar32 = (iVar1 - iVar22) + iVar51;
          if (iVar3 <= iVar32) {
            iVar32 = iVar3;
          }
          if ((0 < iVar27) && (0 < iVar46)) {
            fVar64 = pfVar8[iVar44 + iVar46 + -1];
          }
          if ((0 < iVar27) && (0 < iVar32)) {
            fVar61 = pfVar8[iVar44 + iVar32 + -1];
          }
          fVar63 = 0.0;
          fVar65 = 0.0;
          if ((0 < iVar16) && (0 < iVar46)) {
            fVar65 = pfVar8[iVar46 + -1 + iVar30];
          }
          if ((0 < iVar16) && (0 < iVar32)) {
            fVar63 = pfVar8[iVar32 + -1 + iVar30];
          }
          auVar67 = ZEXT816(0) << 0x40;
          fVar66 = 0.0;
          iVar46 = iVar51 - uVar12;
          if (iVar3 < (int)(iVar51 - uVar12)) {
            iVar46 = iVar3;
          }
          iVar32 = (iVar11 - uVar12) + iVar51;
          if (iVar3 <= iVar32) {
            iVar32 = iVar3;
          }
          if ((0 < iVar27) && (0 < iVar46)) {
            fVar66 = pfVar8[iVar44 + iVar46 + -1];
          }
          fVar68 = 0.0;
          if ((0 < iVar27) && (0 < iVar32)) {
            fVar68 = pfVar8[iVar44 + iVar32 + -1];
          }
          fVar69 = 0.0;
          fVar70 = 0.0;
          if ((0 < iVar16) && (0 < iVar46)) {
            fVar70 = pfVar8[iVar46 + -1 + iVar30];
          }
          if ((0 < iVar16) && (0 < iVar32)) {
            fVar69 = pfVar8[iVar32 + -1 + iVar30];
          }
          iVar46 = -iVar11 + 1 + iVar51;
          fVar62 = 0.0;
          if (iVar3 < iVar46) {
            iVar46 = iVar3;
          }
          iVar33 = iVar46 + -1;
          iVar32 = iVar11 + iVar51;
          if (iVar3 <= iVar11 + iVar51) {
            iVar32 = iVar3;
          }
          auVar9 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar61) - fVar65) + fVar63)),auVar67);
          auVar58 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar66 - fVar68) - fVar70))),
                               ZEXT816(0) << 0x40);
          auVar9 = vfmadd132ss_fma(auVar58,auVar9,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar35) && (0 < iVar46)) {
            fVar64 = pfVar8[iVar24 + iVar33];
          }
          iVar47 = iVar32 + -1;
          if ((0 < iVar35) && (0 < iVar32)) {
            fVar62 = pfVar8[iVar24 + iVar47];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar31) && (0 < iVar46)) {
            fVar61 = pfVar8[iVar23 + iVar33];
          }
          if ((0 < iVar31) && (0 < iVar32)) {
            fVar65 = pfVar8[iVar23 + iVar47];
          }
          if ((0 < iVar55) && (0 < iVar46)) {
            auVar67 = ZEXT416((uint)pfVar8[iVar41 + iVar33]);
          }
          fVar63 = 0.0;
          if ((0 < iVar55) && (0 < iVar32)) {
            fVar63 = pfVar8[iVar41 + iVar47];
          }
          fVar68 = 0.0;
          fVar66 = 0.0;
          if ((0 < iVar37) && (0 < iVar46)) {
            fVar66 = pfVar8[iVar33 + iVar36];
          }
          if ((0 < iVar37) && (0 < iVar32)) {
            fVar68 = pfVar8[iVar47 + iVar36];
          }
          fVar70 = 0.0;
          iVar46 = iVar51 + 1;
          if (iVar3 < iVar51 + 1) {
            iVar46 = iVar3;
          }
          iVar33 = iVar46 + -1;
          iVar32 = iVar51 + 1 + iVar11;
          if (iVar3 <= iVar32) {
            iVar32 = iVar3;
          }
          auVar58 = vmaxss_avx(ZEXT416((uint)(((fVar64 - fVar62) - fVar61) + fVar65)),
                               ZEXT816(0) << 0x40);
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar68 + ((auVar67._0_4_ - fVar63) - fVar66))),
                               ZEXT816(0) << 0x40);
          auVar67 = vfmadd132ss_fma(auVar67,auVar58,SUB6416(ZEXT464(0xc0400000),0));
          fVar64 = 0.0;
          if ((0 < iVar17) && (0 < iVar46)) {
            fVar64 = pfVar8[iVar38 + iVar33];
          }
          iVar47 = iVar32 + -1;
          if ((0 < iVar17) && (0 < iVar32)) {
            fVar70 = pfVar8[iVar38 + iVar47];
          }
          fVar65 = 0.0;
          fVar61 = 0.0;
          if ((0 < iVar52) && (0 < iVar46)) {
            fVar61 = pfVar8[iVar56 + iVar33];
          }
          if ((0 < iVar52) && (0 < iVar32)) {
            fVar65 = pfVar8[iVar56 + iVar47];
          }
          iVar53 = -iVar11 + iVar51;
          fVar63 = 0.0;
          if (iVar3 < iVar53) {
            iVar53 = iVar3;
          }
          iVar43 = iVar3;
          if (iVar51 < iVar3) {
            iVar43 = iVar51;
          }
          iVar54 = iVar53 + -1;
          if ((0 < iVar34) && (0 < iVar53)) {
            fVar63 = pfVar8[iVar42 + iVar54];
          }
          iVar39 = iVar43 + -1;
          fVar66 = 0.0;
          if ((0 < iVar34) && (0 < iVar43)) {
            fVar66 = pfVar8[iVar42 + iVar39];
          }
          fVar69 = 0.0;
          fVar68 = 0.0;
          if ((0 < iVar15) && (0 < iVar53)) {
            fVar68 = pfVar8[iVar28 + iVar54];
          }
          if ((0 < iVar15) && (0 < iVar43)) {
            fVar69 = pfVar8[iVar28 + iVar39];
          }
          auVar58 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          in_ZMM16 = ZEXT1664(auVar58);
          if ((0 < iVar17) && (0 < iVar53)) {
            in_ZMM16 = ZEXT464((uint)pfVar8[iVar38 + iVar54]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
          in_ZMM17 = ZEXT1664(auVar58);
          if ((0 < iVar17) && (0 < iVar43)) {
            in_ZMM17 = ZEXT464((uint)pfVar8[iVar38 + iVar39]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          in_ZMM18 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar58);
          if ((0 < iVar52) && (0 < iVar53)) {
            in_ZMM19 = ZEXT464((uint)pfVar8[iVar54 + iVar56]);
          }
          if ((0 < iVar52) && (0 < iVar43)) {
            in_ZMM18 = ZEXT464((uint)pfVar8[iVar39 + iVar56]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          in_ZMM21 = ZEXT1664(auVar58);
          if ((0 < iVar34) && (0 < iVar46)) {
            in_ZMM21 = ZEXT464((uint)pfVar8[iVar42 + iVar33]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          in_ZMM22 = ZEXT1664(auVar58);
          if ((0 < iVar34) && (0 < iVar32)) {
            in_ZMM22 = ZEXT464((uint)pfVar8[iVar42 + iVar47]);
          }
          auVar58 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          in_ZMM23 = ZEXT1664(auVar58);
          auVar58 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          in_ZMM24 = ZEXT1664(auVar58);
          if ((0 < iVar15) && (0 < iVar46)) {
            in_ZMM24 = ZEXT464((uint)pfVar8[iVar33 + iVar28]);
          }
          if ((0 < iVar15) && (0 < iVar32)) {
            in_ZMM23 = ZEXT464((uint)pfVar8[iVar47 + iVar28]);
          }
          fVar62 = fVar60 * auVar9._0_4_;
          fVar10 = fVar60 * auVar67._0_4_;
          auVar67 = vmaxss_avx(ZEXT416((uint)(fVar65 + ((fVar64 - fVar70) - fVar61))),
                               ZEXT816(0) << 0x40);
          auVar9 = vmaxss_avx(ZEXT416((uint)(fVar69 + ((fVar63 - fVar66) - fVar68))),
                              ZEXT816(0) << 0x40);
          auVar58 = vsubss_avx512f(in_ZMM16._0_16_,in_ZMM17._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM19._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM18._0_16_);
          auVar59 = vmaxss_avx512f(auVar58,auVar57);
          auVar58 = vsubss_avx512f(in_ZMM21._0_16_,in_ZMM22._0_16_);
          auVar58 = vsubss_avx512f(auVar58,in_ZMM24._0_16_);
          auVar58 = vaddss_avx512f(auVar58,in_ZMM23._0_16_);
          auVar58 = vmaxss_avx(auVar58,ZEXT816(0) << 0x40);
          fVar64 = fVar60 * (((auVar67._0_4_ + auVar9._0_4_) - auVar59._0_4_) - auVar58._0_4_);
          auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar64 * fVar64 * -0.81)),ZEXT416((uint)fVar62),
                                    ZEXT416((uint)fVar10));
          pfVar6[lVar19] = auVar67._0_4_;
          pbVar7[lVar19] = 0.0 <= fVar62 + fVar10;
          lVar19 = lVar19 + 1;
          iVar51 = iVar51 + iVar2;
        } while (iVar51 < iVar50);
      }
      iVar14 = iVar14 + iVar2;
    } while (iVar14 < iVar18);
  }
  return;
}

Assistant:

void compute_response_layer_Dyy_top(struct response_layer* layer, struct integral_image* iimage) {
    /*
        base function: compute_response_layer_Dyy_leftcorner

        optimization:
        - Dyy box filter hand optimized and split into cases
            => here only top cases
    */
    float Dxx, Dyy, Dxy;
    int x, y, k, k0;
    int r00, r01, c00, c01, r10, r11, c10, c11;
    float Dyy0, Dyy1, A, B, C, D, temp0, temp1;

    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int data_width = iimage->data_width;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size / 3;
    int border = (filter_size - 1) / 2;
    float inv_area = 1.f / (filter_size*filter_size);

    int ind = 0;  // oder alternativ (i+1)*j

    float *data = (float*) iimage->data;  // brauch hier keinen cast weil es eig float sein sollte
    int iheight = iimage->height;
    int iwidth = iimage->width;

    // Top Left Corner - Case 1: B of neg part outside
    for (int i = 0; i < lobe / 2 + 1; i += step) {  // Inner B is outside, i.e. 0
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {  // c0 = col - 1 = (y - lobe + 1) -1 < 0
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy  
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;  // -1 is already part of r10
            c11 = y + lobe - 1;

            D = data[r11 * data_width + c11];
            Dyy1 = D;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Left Corner - Case 2: B of neg part inside
    // initial value has to be rounded up to next bigger step
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border + 1; i += step) {  // Inner B is inside
        ind = (i / step) * width;

        for (int j = 0; j < lobe; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c01 = y + lobe - 1;

            Dyy0 = data[r01 * data_width + c01];

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // -1 is already part of r10
            c11 = y + lobe - 1;

            B = data[r10 * data_width + c11];
            D = data[r11 * data_width + c11];
            Dyy1 = D - B;

            Dyy = Dyy0 - 3 * Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 1: B of neg part outside
    k0 = (lobe + step - 1) / step * step;  // initial y value to next multiple of step

    for (int i = 0; i < lobe / 2 + 1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            // A and B are outside (= 0), C and D inside
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            // A and B are outside (= 0), C and D inside
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;   // r10 und r11 kann man vereinfachen
            c10 = y - lobe;
            c11 = y + lobe - 1;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Mid - Case 2: B of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;  // round initial value to next highest step
    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step -lobe+1; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Compute Dyy
            // whole box filter
            r01 = x + border;
            c00 = y - lobe;
            c01 = y + lobe - 1;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + c01];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;
            c11 = y + lobe - 1;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + c11];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + c11];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 1: A of neg part outside
    k0 = (width*step-lobe+1 + step - 1) / step * step;

    for (int i = 0; i < lobe/2+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            Dyy1 = D - C;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Top Right - Case 2: A of neg part inside
    k = (lobe / 2 + 1 + step - 1) / step * step;

    for (int i = k; i < border+1; i += step) {
        ind = (i / step) * width + (k0 / step);

        for (int j = k0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // whole filter
            r01 = x + border;
            c00 = y - lobe;

            C = data[r01 * data_width + c00];
            D = data[r01 * data_width + iwidth-1];
            Dyy0 = D - C;

            // neg part box filter
            r10 = x - lobe / 2 - 1;
            r11 = r10 + lobe;
            c10 = y - lobe;

            A = data[r10 * data_width + c10];
            B = data[r10 * data_width + iwidth-1];
            C = data[r11 * data_width + c10];
            D = data[r11 * data_width + iwidth-1];

            temp0 = A - C;
            temp1 = D - B;
            Dyy1 = temp0 + temp1;

            Dyy = Dyy0 - 3*Dyy1;

            // Compute Dxx, Dxy
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                    + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                    - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                    - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }

    // Rest
    k = (border + 1 + step - 1) / step * step;

    for (int i = k; i < height * step; i += step) {
        ind = (i / step) * width;

        for (int j = 0; j < width * step; j += step) {
            // Image coordinates
            x = i;
            y = j;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dxx = box_integral(iimage, x - lobe + 1, y - border, 2 * lobe - 1, filter_size) -
                  3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2 * lobe - 1, lobe);
            Dyy = box_integral(iimage, x - border, y - lobe + 1, filter_size, 2 * lobe - 1) -
                  3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
            Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe) +
                  box_integral(iimage, x + 1, y - lobe, lobe, lobe) -
                  box_integral(iimage, x - lobe, y - lobe, lobe, lobe) - box_integral(iimage, x + 1, y + 1, lobe, lobe);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0 ? true : false);
            ind += 1;
        }
    }
}